

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_8.c
# Opt level: O2

parasail_result_t *
parasail_sw_rowcol_striped_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  byte *pbVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  parasail_result_t *result;
  __m128i *palVar9;
  __m128i *palVar10;
  __m128i *b;
  long lVar11;
  __m128i *palVar12;
  bool bVar13;
  undefined4 in_register_0000000c;
  undefined8 uVar14;
  char *pcVar15;
  undefined8 extraout_RDX;
  int iVar16;
  int iVar17;
  char *__format;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  byte bVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char cVar25;
  char cVar26;
  undefined1 auVar27 [16];
  char cVar28;
  ulong uVar30;
  undefined1 auVar31 [16];
  __m128i alVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  undefined1 auVar51 [16];
  char cVar67;
  undefined1 auVar52 [16];
  byte bVar68;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  byte bVar82;
  byte bVar83;
  byte bVar84;
  undefined1 auVar69 [16];
  __m128i c;
  __m128i c_00;
  __m128i *local_c8;
  ulong local_b0;
  ulong local_90;
  char local_80;
  size_t len;
  longlong extraout_RDX_00;
  char cVar29;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  
  uVar14 = CONCAT44(in_register_0000000c,open);
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile8.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else {
          local_90 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar15 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar15 = "open";
          }
          else {
            if (-1 < gap) {
              uVar22 = (ulong)uVar2 + 0xf >> 4;
              uVar8 = uVar2 - 1;
              iVar17 = ppVar4->max;
              result = parasail_result_new_rowcol1((uint)((ulong)uVar2 + 0xf) & 0x7ffffff0,s2Len);
              if (result != (parasail_result_t *)0x0) {
                result->flag = result->flag | 0x10140804;
                palVar9 = parasail_memalign___m128i(0x10,uVar22);
                palVar10 = parasail_memalign___m128i(0x10,uVar22);
                local_c8 = parasail_memalign___m128i(0x10,uVar22);
                b = parasail_memalign___m128i(0x10,uVar22);
                bVar13 = palVar10 == (__m128i *)0x0 || palVar9 == (__m128i *)0x0;
                len = CONCAT71((int7)((ulong)uVar14 >> 8),bVar13);
                c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
                c[1]._0_1_ = (b == (__m128i *)0x0 || local_c8 == (__m128i *)0x0) || bVar13;
                if ((b != (__m128i *)0x0 && local_c8 != (__m128i *)0x0) &&
                    (palVar10 != (__m128i *)0x0 && palVar9 != (__m128i *)0x0)) {
                  local_b0 = 0;
                  auVar23 = pshufb(ZEXT416((uint)open),(undefined1  [16])0x0);
                  auVar24 = pshufb(ZEXT416((uint)gap),(undefined1  [16])0x0);
                  c[0] = uVar22;
                  parasail_memset___m128i(palVar9,c,len);
                  c_00[1] = extraout_RDX_00;
                  c_00[0] = uVar22;
                  parasail_memset___m128i(b,c_00,len);
                  auVar7 = _DAT_008a2460;
                  auVar6 = _DAT_008a1f40;
                  uVar2 = (uint)uVar22;
                  local_80 = (char)iVar17;
                  lVar11 = uVar22 * 0x10;
                  bVar21 = 0x80;
                  uVar20 = 0;
                  auVar51 = _DAT_008a1f40;
                  auVar27 = _DAT_008a1f40;
                  do {
                    if (uVar20 == local_90) {
LAB_006b906f:
                      for (uVar20 = 0; uVar2 * 4 != uVar20; uVar20 = uVar20 + 4) {
                        pcVar15 = (char *)((long)*palVar9 + uVar20 * 4);
                        cVar25 = pcVar15[1];
                        cVar26 = pcVar15[2];
                        cVar42 = pcVar15[3];
                        cVar43 = pcVar15[4];
                        cVar44 = pcVar15[5];
                        cVar45 = pcVar15[6];
                        cVar46 = pcVar15[7];
                        cVar47 = pcVar15[8];
                        cVar29 = pcVar15[9];
                        cVar35 = pcVar15[10];
                        cVar36 = pcVar15[0xb];
                        cVar37 = pcVar15[0xc];
                        cVar38 = pcVar15[0xd];
                        cVar39 = pcVar15[0xe];
                        cVar40 = pcVar15[0xf];
                        piVar5 = ((result->field_4).rowcols)->score_col;
                        *(int *)((long)piVar5 + uVar20) = *pcVar15 + 0x80;
                        *(int *)((long)piVar5 + uVar2 * 4 + uVar20) = cVar25 + 0x80;
                        *(int *)((long)piVar5 + uVar2 * 8 + uVar20) = cVar26 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0xc + uVar20) = cVar42 + 0x80;
                        *(int *)((long)piVar5 + lVar11 + uVar20) = cVar43 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0x14 + uVar20) = cVar44 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0x18 + uVar20) = cVar45 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0x1c + uVar20) = cVar46 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0x20 + uVar20) = cVar47 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0x24 + uVar20) = cVar29 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0x28 + uVar20) = cVar35 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0x2c + uVar20) = cVar36 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0x30 + uVar20) = cVar37 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0x34 + uVar20) = cVar38 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0x38 + uVar20) = cVar39 + 0x80;
                        *(int *)((long)piVar5 + uVar22 * 0x3c + uVar20) = cVar40 + 0x80;
                      }
                      if (bVar21 == 0x7f) {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                      }
                      iVar17 = parasail_result_is_saturated(result);
                      palVar12 = local_c8;
                      if (iVar17 == 0) {
                        iVar17 = (int)local_90 + -1;
                        iVar16 = (int)local_90 + -2;
                        if ((int)local_b0 == iVar16) {
                          palVar12 = palVar10;
                        }
                        if ((int)local_b0 == iVar17) {
                          palVar12 = palVar9;
                          palVar9 = local_c8;
                        }
                        for (uVar22 = 0; (uVar2 & 0x7ffffff) << 4 != (uint)uVar22;
                            uVar22 = uVar22 + 1) {
                          if ((*(byte *)((long)*palVar12 + uVar22) == bVar21) &&
                             (uVar19 = ((uint)uVar22 & 0xf) * uVar2 +
                                       ((uint)(uVar22 >> 4) & 0xfffffff), (int)uVar19 < (int)uVar8))
                          {
                            uVar8 = uVar19;
                          }
                        }
                        if ((int)local_b0 != iVar16) {
                          local_c8 = palVar10;
                        }
                        if ((int)local_b0 != iVar17) {
                          palVar10 = local_c8;
                        }
                        iVar17 = (char)bVar21 + 0x80;
                      }
                      else {
                        local_b0._0_4_ = 0;
                        iVar17 = 0xff;
                        uVar8 = 0;
                      }
                      result->score = iVar17;
                      result->end_query = uVar8;
                      result->end_ref = (int)local_b0;
                      parasail_free(b);
                      parasail_free(palVar12);
                      parasail_free(palVar10);
                      parasail_free(palVar9);
                      return result;
                    }
                    uVar30 = palVar9[uVar2 - 1][0];
                    auVar50._8_8_ = palVar9[uVar2 - 1][1] << 8 | uVar30 >> 0x38;
                    auVar50._0_8_ = uVar30 << 8 | 0x80;
                    iVar17 = ppVar4->mapper[(byte)s2[uVar20]];
                    iVar16 = (int)uVar20 + -2;
                    palVar12 = palVar10;
                    if ((int)local_b0 == iVar16) {
                      palVar12 = local_c8;
                    }
                    auVar31 = auVar6;
                    for (lVar18 = 0; lVar11 != lVar18; lVar18 = lVar18 + 0x10) {
                      auVar48 = paddsb(auVar50,*(undefined1 (*) [16])
                                                ((long)pvVar3 +
                                                lVar18 + (long)(int)(iVar17 * uVar2) * 0x10));
                      auVar50 = *(undefined1 (*) [16])((long)*b + lVar18);
                      cVar25 = auVar31[0];
                      cVar26 = auVar50[0];
                      bVar68 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[1];
                      cVar26 = auVar50[1];
                      bVar70 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[2];
                      cVar26 = auVar50[2];
                      bVar71 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[3];
                      cVar26 = auVar50[3];
                      bVar72 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[4];
                      cVar26 = auVar50[4];
                      bVar73 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[5];
                      cVar26 = auVar50[5];
                      bVar74 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[6];
                      cVar26 = auVar50[6];
                      bVar75 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[7];
                      cVar26 = auVar50[7];
                      bVar76 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[8];
                      cVar26 = auVar50[8];
                      bVar77 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[9];
                      cVar26 = auVar50[9];
                      bVar78 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[10];
                      cVar26 = auVar50[10];
                      bVar79 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[0xb];
                      cVar26 = auVar50[0xb];
                      bVar80 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[0xc];
                      cVar26 = auVar50[0xc];
                      bVar81 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[0xd];
                      cVar26 = auVar50[0xd];
                      bVar82 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[0xe];
                      cVar26 = auVar50[0xe];
                      cVar42 = auVar50[0xf];
                      bVar83 = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                      cVar25 = auVar31[0xf];
                      bVar84 = (cVar42 < cVar25) * cVar25 | (cVar42 >= cVar25) * cVar42;
                      cVar25 = auVar48[0];
                      auVar69[0] = ((char)bVar68 < cVar25) * cVar25 |
                                   ((char)bVar68 >= cVar25) * bVar68;
                      cVar25 = auVar48[1];
                      auVar69[1] = ((char)bVar70 < cVar25) * cVar25 |
                                   ((char)bVar70 >= cVar25) * bVar70;
                      cVar25 = auVar48[2];
                      auVar69[2] = ((char)bVar71 < cVar25) * cVar25 |
                                   ((char)bVar71 >= cVar25) * bVar71;
                      cVar25 = auVar48[3];
                      auVar69[3] = ((char)bVar72 < cVar25) * cVar25 |
                                   ((char)bVar72 >= cVar25) * bVar72;
                      cVar25 = auVar48[4];
                      auVar69[4] = ((char)bVar73 < cVar25) * cVar25 |
                                   ((char)bVar73 >= cVar25) * bVar73;
                      cVar25 = auVar48[5];
                      auVar69[5] = ((char)bVar74 < cVar25) * cVar25 |
                                   ((char)bVar74 >= cVar25) * bVar74;
                      cVar25 = auVar48[6];
                      auVar69[6] = ((char)bVar75 < cVar25) * cVar25 |
                                   ((char)bVar75 >= cVar25) * bVar75;
                      cVar25 = auVar48[7];
                      auVar69[7] = ((char)bVar76 < cVar25) * cVar25 |
                                   ((char)bVar76 >= cVar25) * bVar76;
                      cVar25 = auVar48[8];
                      auVar69[8] = ((char)bVar77 < cVar25) * cVar25 |
                                   ((char)bVar77 >= cVar25) * bVar77;
                      cVar25 = auVar48[9];
                      auVar69[9] = ((char)bVar78 < cVar25) * cVar25 |
                                   ((char)bVar78 >= cVar25) * bVar78;
                      cVar25 = auVar48[10];
                      auVar69[10] = ((char)bVar79 < cVar25) * cVar25 |
                                    ((char)bVar79 >= cVar25) * bVar79;
                      cVar25 = auVar48[0xb];
                      auVar69[0xb] = ((char)bVar80 < cVar25) * cVar25 |
                                     ((char)bVar80 >= cVar25) * bVar80;
                      cVar25 = auVar48[0xc];
                      auVar69[0xc] = ((char)bVar81 < cVar25) * cVar25 |
                                     ((char)bVar81 >= cVar25) * bVar81;
                      cVar25 = auVar48[0xd];
                      auVar69[0xd] = ((char)bVar82 < cVar25) * cVar25 |
                                     ((char)bVar82 >= cVar25) * bVar82;
                      cVar25 = auVar48[0xe];
                      auVar69[0xe] = ((char)bVar83 < cVar25) * cVar25 |
                                     ((char)bVar83 >= cVar25) * bVar83;
                      cVar25 = auVar48[0xf];
                      auVar69[0xf] = ((char)bVar84 < cVar25) * cVar25 |
                                     ((char)bVar84 >= cVar25) * bVar84;
                      *(undefined1 (*) [16])((long)*palVar12 + lVar18) = auVar69;
                      cVar25 = auVar51[0];
                      auVar48[0] = (cVar25 < (char)auVar69[0]) * auVar69[0] |
                                   (cVar25 >= (char)auVar69[0]) * cVar25;
                      cVar25 = auVar51[1];
                      auVar48[1] = (cVar25 < (char)auVar69[1]) * auVar69[1] |
                                   (cVar25 >= (char)auVar69[1]) * cVar25;
                      cVar25 = auVar51[2];
                      auVar48[2] = (cVar25 < (char)auVar69[2]) * auVar69[2] |
                                   (cVar25 >= (char)auVar69[2]) * cVar25;
                      cVar25 = auVar51[3];
                      auVar48[3] = (cVar25 < (char)auVar69[3]) * auVar69[3] |
                                   (cVar25 >= (char)auVar69[3]) * cVar25;
                      cVar25 = auVar51[4];
                      auVar48[4] = (cVar25 < (char)auVar69[4]) * auVar69[4] |
                                   (cVar25 >= (char)auVar69[4]) * cVar25;
                      cVar25 = auVar51[5];
                      auVar48[5] = (cVar25 < (char)auVar69[5]) * auVar69[5] |
                                   (cVar25 >= (char)auVar69[5]) * cVar25;
                      cVar25 = auVar51[6];
                      auVar48[6] = (cVar25 < (char)auVar69[6]) * auVar69[6] |
                                   (cVar25 >= (char)auVar69[6]) * cVar25;
                      cVar25 = auVar51[7];
                      auVar48[7] = (cVar25 < (char)auVar69[7]) * auVar69[7] |
                                   (cVar25 >= (char)auVar69[7]) * cVar25;
                      cVar25 = auVar51[8];
                      auVar48[8] = (cVar25 < (char)auVar69[8]) * auVar69[8] |
                                   (cVar25 >= (char)auVar69[8]) * cVar25;
                      cVar25 = auVar51[9];
                      auVar48[9] = (cVar25 < (char)auVar69[9]) * auVar69[9] |
                                   (cVar25 >= (char)auVar69[9]) * cVar25;
                      cVar25 = auVar51[10];
                      auVar48[10] = (cVar25 < (char)auVar69[10]) * auVar69[10] |
                                    (cVar25 >= (char)auVar69[10]) * cVar25;
                      cVar25 = auVar51[0xb];
                      auVar48[0xb] = (cVar25 < (char)auVar69[0xb]) * auVar69[0xb] |
                                     (cVar25 >= (char)auVar69[0xb]) * cVar25;
                      cVar25 = auVar51[0xc];
                      auVar48[0xc] = (cVar25 < (char)auVar69[0xc]) * auVar69[0xc] |
                                     (cVar25 >= (char)auVar69[0xc]) * cVar25;
                      cVar25 = auVar51[0xd];
                      auVar48[0xd] = (cVar25 < (char)auVar69[0xd]) * auVar69[0xd] |
                                     (cVar25 >= (char)auVar69[0xd]) * cVar25;
                      cVar25 = auVar51[0xe];
                      cVar26 = auVar51[0xf];
                      auVar48[0xe] = (cVar25 < (char)auVar69[0xe]) * auVar69[0xe] |
                                     (cVar25 >= (char)auVar69[0xe]) * cVar25;
                      auVar48[0xf] = (cVar26 < (char)auVar69[0xf]) * auVar69[0xf] |
                                     (cVar26 >= (char)auVar69[0xf]) * cVar26;
                      auVar69 = psubsb(auVar69,auVar23);
                      auVar51 = psubsb(auVar50,auVar24);
                      cVar25 = auVar69[0];
                      cVar28 = auVar51[0];
                      cVar26 = auVar69[1];
                      cVar53 = auVar51[1];
                      cVar42 = auVar69[2];
                      cVar54 = auVar51[2];
                      cVar43 = auVar69[3];
                      cVar55 = auVar51[3];
                      cVar44 = auVar69[4];
                      cVar56 = auVar51[4];
                      cVar45 = auVar69[5];
                      cVar57 = auVar51[5];
                      cVar46 = auVar69[6];
                      cVar58 = auVar51[6];
                      cVar47 = auVar69[7];
                      cVar59 = auVar51[7];
                      cVar29 = auVar69[8];
                      cVar60 = auVar51[8];
                      cVar35 = auVar69[9];
                      cVar61 = auVar51[9];
                      cVar36 = auVar69[10];
                      cVar62 = auVar51[10];
                      cVar37 = auVar69[0xb];
                      cVar63 = auVar51[0xb];
                      cVar38 = auVar69[0xc];
                      cVar64 = auVar51[0xc];
                      cVar39 = auVar69[0xd];
                      cVar65 = auVar51[0xd];
                      cVar40 = auVar69[0xe];
                      cVar66 = auVar51[0xe];
                      cVar67 = auVar51[0xf];
                      cVar41 = auVar69[0xf];
                      pbVar1 = (byte *)((long)*b + lVar18);
                      *pbVar1 = (cVar28 < cVar25) * cVar25 | (cVar28 >= cVar25) * cVar28;
                      pbVar1[1] = (cVar53 < cVar26) * cVar26 | (cVar53 >= cVar26) * cVar53;
                      pbVar1[2] = (cVar54 < cVar42) * cVar42 | (cVar54 >= cVar42) * cVar54;
                      pbVar1[3] = (cVar55 < cVar43) * cVar43 | (cVar55 >= cVar43) * cVar55;
                      pbVar1[4] = (cVar56 < cVar44) * cVar44 | (cVar56 >= cVar44) * cVar56;
                      pbVar1[5] = (cVar57 < cVar45) * cVar45 | (cVar57 >= cVar45) * cVar57;
                      pbVar1[6] = (cVar58 < cVar46) * cVar46 | (cVar58 >= cVar46) * cVar58;
                      pbVar1[7] = (cVar59 < cVar47) * cVar47 | (cVar59 >= cVar47) * cVar59;
                      pbVar1[8] = (cVar60 < cVar29) * cVar29 | (cVar60 >= cVar29) * cVar60;
                      pbVar1[9] = (cVar61 < cVar35) * cVar35 | (cVar61 >= cVar35) * cVar61;
                      pbVar1[10] = (cVar62 < cVar36) * cVar36 | (cVar62 >= cVar36) * cVar62;
                      pbVar1[0xb] = (cVar63 < cVar37) * cVar37 | (cVar63 >= cVar37) * cVar63;
                      pbVar1[0xc] = (cVar64 < cVar38) * cVar38 | (cVar64 >= cVar38) * cVar64;
                      pbVar1[0xd] = (cVar65 < cVar39) * cVar39 | (cVar65 >= cVar39) * cVar65;
                      pbVar1[0xe] = (cVar66 < cVar40) * cVar40 | (cVar66 >= cVar40) * cVar66;
                      pbVar1[0xf] = (cVar67 < cVar41) * cVar41 | (cVar67 >= cVar41) * cVar67;
                      auVar51 = psubsb(auVar31,auVar24);
                      cVar28 = auVar51[0];
                      auVar31[0] = (cVar28 < cVar25) * cVar25 | (cVar28 >= cVar25) * cVar28;
                      cVar25 = auVar51[1];
                      auVar31[1] = (cVar25 < cVar26) * cVar26 | (cVar25 >= cVar26) * cVar25;
                      cVar25 = auVar51[2];
                      auVar31[2] = (cVar25 < cVar42) * cVar42 | (cVar25 >= cVar42) * cVar25;
                      cVar25 = auVar51[3];
                      auVar31[3] = (cVar25 < cVar43) * cVar43 | (cVar25 >= cVar43) * cVar25;
                      cVar25 = auVar51[4];
                      auVar31[4] = (cVar25 < cVar44) * cVar44 | (cVar25 >= cVar44) * cVar25;
                      cVar25 = auVar51[5];
                      auVar31[5] = (cVar25 < cVar45) * cVar45 | (cVar25 >= cVar45) * cVar25;
                      cVar25 = auVar51[6];
                      auVar31[6] = (cVar25 < cVar46) * cVar46 | (cVar25 >= cVar46) * cVar25;
                      cVar25 = auVar51[7];
                      auVar31[7] = (cVar25 < cVar47) * cVar47 | (cVar25 >= cVar47) * cVar25;
                      cVar25 = auVar51[8];
                      auVar31[8] = (cVar25 < cVar29) * cVar29 | (cVar25 >= cVar29) * cVar25;
                      cVar25 = auVar51[9];
                      auVar31[9] = (cVar25 < cVar35) * cVar35 | (cVar25 >= cVar35) * cVar25;
                      cVar25 = auVar51[10];
                      auVar31[10] = (cVar25 < cVar36) * cVar36 | (cVar25 >= cVar36) * cVar25;
                      cVar25 = auVar51[0xb];
                      auVar31[0xb] = (cVar25 < cVar37) * cVar37 | (cVar25 >= cVar37) * cVar25;
                      cVar25 = auVar51[0xc];
                      auVar31[0xc] = (cVar25 < cVar38) * cVar38 | (cVar25 >= cVar38) * cVar25;
                      cVar25 = auVar51[0xd];
                      auVar31[0xd] = (cVar25 < cVar39) * cVar39 | (cVar25 >= cVar39) * cVar25;
                      cVar25 = auVar51[0xe];
                      cVar26 = auVar51[0xf];
                      auVar31[0xe] = (cVar25 < cVar40) * cVar40 | (cVar25 >= cVar40) * cVar25;
                      auVar31[0xf] = (cVar26 < cVar41) * cVar41 | (cVar26 >= cVar41) * cVar26;
                      auVar50 = *(undefined1 (*) [16])((long)*palVar9 + lVar18);
                      auVar51 = auVar48;
                    }
                    if ((int)local_b0 == iVar16) {
                      local_c8 = palVar10;
                    }
                    for (iVar17 = 0; iVar17 != 0x10; iVar17 = iVar17 + 1) {
                      uVar30 = auVar31._0_8_;
                      auVar31._8_8_ = auVar31._8_8_ << 8 | uVar30 >> 0x38;
                      auVar31._0_8_ = uVar30 << 8 | 0x80;
                      lVar18 = 0;
                      auVar50 = auVar51;
                      while (lVar11 + 0x10 != lVar18 + 0x10) {
                        pcVar15 = (char *)((long)*palVar12 + lVar18);
                        cVar26 = *pcVar15;
                        cVar42 = pcVar15[1];
                        cVar43 = pcVar15[2];
                        cVar44 = pcVar15[3];
                        cVar45 = pcVar15[4];
                        cVar46 = pcVar15[5];
                        cVar47 = pcVar15[6];
                        cVar29 = pcVar15[7];
                        cVar35 = pcVar15[8];
                        cVar36 = pcVar15[9];
                        cVar37 = pcVar15[10];
                        cVar38 = pcVar15[0xb];
                        cVar39 = pcVar15[0xc];
                        cVar40 = pcVar15[0xd];
                        cVar41 = pcVar15[0xe];
                        cVar28 = pcVar15[0xf];
                        cVar25 = auVar31[0];
                        auVar49[0] = (cVar26 < cVar25) * cVar25 | (cVar26 >= cVar25) * cVar26;
                        cVar25 = auVar31[1];
                        auVar49[1] = (cVar42 < cVar25) * cVar25 | (cVar42 >= cVar25) * cVar42;
                        cVar25 = auVar31[2];
                        auVar49[2] = (cVar43 < cVar25) * cVar25 | (cVar43 >= cVar25) * cVar43;
                        cVar25 = auVar31[3];
                        auVar49[3] = (cVar44 < cVar25) * cVar25 | (cVar44 >= cVar25) * cVar44;
                        cVar25 = auVar31[4];
                        auVar49[4] = (cVar45 < cVar25) * cVar25 | (cVar45 >= cVar25) * cVar45;
                        cVar25 = auVar31[5];
                        auVar49[5] = (cVar46 < cVar25) * cVar25 | (cVar46 >= cVar25) * cVar46;
                        cVar25 = auVar31[6];
                        auVar49[6] = (cVar47 < cVar25) * cVar25 | (cVar47 >= cVar25) * cVar47;
                        cVar25 = auVar31[7];
                        auVar49[7] = (cVar29 < cVar25) * cVar25 | (cVar29 >= cVar25) * cVar29;
                        cVar25 = auVar31[8];
                        auVar49[8] = (cVar35 < cVar25) * cVar25 | (cVar35 >= cVar25) * cVar35;
                        cVar25 = auVar31[9];
                        auVar49[9] = (cVar36 < cVar25) * cVar25 | (cVar36 >= cVar25) * cVar36;
                        cVar25 = auVar31[10];
                        auVar49[10] = (cVar37 < cVar25) * cVar25 | (cVar37 >= cVar25) * cVar37;
                        cVar25 = auVar31[0xb];
                        auVar49[0xb] = (cVar38 < cVar25) * cVar25 | (cVar38 >= cVar25) * cVar38;
                        cVar25 = auVar31[0xc];
                        auVar49[0xc] = (cVar39 < cVar25) * cVar25 | (cVar39 >= cVar25) * cVar39;
                        cVar25 = auVar31[0xd];
                        auVar49[0xd] = (cVar40 < cVar25) * cVar25 | (cVar40 >= cVar25) * cVar40;
                        cVar25 = auVar31[0xe];
                        auVar49[0xe] = (cVar41 < cVar25) * cVar25 | (cVar41 >= cVar25) * cVar41;
                        cVar25 = auVar31[0xf];
                        auVar49[0xf] = (cVar28 < cVar25) * cVar25 | (cVar28 >= cVar25) * cVar28;
                        *(undefined1 (*) [16])((long)*palVar12 + lVar18) = auVar49;
                        cVar25 = auVar50[0];
                        auVar51[0] = (cVar25 < (char)auVar49[0]) * auVar49[0] |
                                     (cVar25 >= (char)auVar49[0]) * cVar25;
                        cVar25 = auVar50[1];
                        auVar51[1] = (cVar25 < (char)auVar49[1]) * auVar49[1] |
                                     (cVar25 >= (char)auVar49[1]) * cVar25;
                        cVar25 = auVar50[2];
                        auVar51[2] = (cVar25 < (char)auVar49[2]) * auVar49[2] |
                                     (cVar25 >= (char)auVar49[2]) * cVar25;
                        cVar25 = auVar50[3];
                        auVar51[3] = (cVar25 < (char)auVar49[3]) * auVar49[3] |
                                     (cVar25 >= (char)auVar49[3]) * cVar25;
                        cVar25 = auVar50[4];
                        auVar51[4] = (cVar25 < (char)auVar49[4]) * auVar49[4] |
                                     (cVar25 >= (char)auVar49[4]) * cVar25;
                        cVar25 = auVar50[5];
                        auVar51[5] = (cVar25 < (char)auVar49[5]) * auVar49[5] |
                                     (cVar25 >= (char)auVar49[5]) * cVar25;
                        cVar25 = auVar50[6];
                        auVar51[6] = (cVar25 < (char)auVar49[6]) * auVar49[6] |
                                     (cVar25 >= (char)auVar49[6]) * cVar25;
                        cVar25 = auVar50[7];
                        auVar51[7] = (cVar25 < (char)auVar49[7]) * auVar49[7] |
                                     (cVar25 >= (char)auVar49[7]) * cVar25;
                        cVar25 = auVar50[8];
                        auVar51[8] = (cVar25 < (char)auVar49[8]) * auVar49[8] |
                                     (cVar25 >= (char)auVar49[8]) * cVar25;
                        cVar25 = auVar50[9];
                        auVar51[9] = (cVar25 < (char)auVar49[9]) * auVar49[9] |
                                     (cVar25 >= (char)auVar49[9]) * cVar25;
                        cVar25 = auVar50[10];
                        auVar51[10] = (cVar25 < (char)auVar49[10]) * auVar49[10] |
                                      (cVar25 >= (char)auVar49[10]) * cVar25;
                        cVar25 = auVar50[0xb];
                        auVar51[0xb] = (cVar25 < (char)auVar49[0xb]) * auVar49[0xb] |
                                       (cVar25 >= (char)auVar49[0xb]) * cVar25;
                        cVar25 = auVar50[0xc];
                        auVar51[0xc] = (cVar25 < (char)auVar49[0xc]) * auVar49[0xc] |
                                       (cVar25 >= (char)auVar49[0xc]) * cVar25;
                        cVar25 = auVar50[0xd];
                        auVar51[0xd] = (cVar25 < (char)auVar49[0xd]) * auVar49[0xd] |
                                       (cVar25 >= (char)auVar49[0xd]) * cVar25;
                        cVar25 = auVar50[0xe];
                        cVar26 = auVar50[0xf];
                        auVar51[0xe] = (cVar25 < (char)auVar49[0xe]) * auVar49[0xe] |
                                       (cVar25 >= (char)auVar49[0xe]) * cVar25;
                        auVar51[0xf] = (cVar26 < (char)auVar49[0xf]) * auVar49[0xf] |
                                       (cVar26 >= (char)auVar49[0xf]) * cVar26;
                        auVar50 = psubsb(auVar49,auVar23);
                        auVar31 = psubsb(auVar31,auVar24);
                        auVar52[0] = -(auVar50[0] < auVar31[0]);
                        auVar52[1] = -(auVar50[1] < auVar31[1]);
                        auVar52[2] = -(auVar50[2] < auVar31[2]);
                        auVar52[3] = -(auVar50[3] < auVar31[3]);
                        auVar52[4] = -(auVar50[4] < auVar31[4]);
                        auVar52[5] = -(auVar50[5] < auVar31[5]);
                        auVar52[6] = -(auVar50[6] < auVar31[6]);
                        auVar52[7] = -(auVar50[7] < auVar31[7]);
                        auVar52[8] = -(auVar50[8] < auVar31[8]);
                        auVar52[9] = -(auVar50[9] < auVar31[9]);
                        auVar52[10] = -(auVar50[10] < auVar31[10]);
                        auVar52[0xb] = -(auVar50[0xb] < auVar31[0xb]);
                        auVar52[0xc] = -(auVar50[0xc] < auVar31[0xc]);
                        auVar52[0xd] = -(auVar50[0xd] < auVar31[0xd]);
                        auVar52[0xe] = -(auVar50[0xe] < auVar31[0xe]);
                        bVar13 = auVar50[0xf] < auVar31[0xf];
                        auVar52[0xf] = -bVar13;
                        lVar18 = lVar18 + 0x10;
                        auVar50 = auVar51;
                        if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) ==
                                          (undefined1  [16])0x0 &&
                                         (auVar52 >> 0xf & (undefined1  [16])0x1) ==
                                         (undefined1  [16])0x0) &&
                                        (auVar52 >> 0x17 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0) &&
                                       (auVar52 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar52 >> 0x27 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar52 >> 0x2f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar52 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar52 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar52 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar52 >> 0x4f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar52 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar52 >> 0x67 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar52 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar52 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            !bVar13) goto LAB_006b8f92;
                      }
                      auVar51 = auVar50;
                    }
LAB_006b8f92:
                    alVar32 = palVar12[(ulong)uVar8 % uVar22];
                    iVar17 = 0;
                    while( true ) {
                      uVar30 = alVar32[0];
                      lVar18 = alVar32[1];
                      if (0xf - (int)(uVar8 / uVar22) <= iVar17) break;
                      alVar32[0] = uVar30 << 8;
                      alVar32[1] = lVar18 << 8 | uVar30 >> 0x38;
                      iVar17 = iVar17 + 1;
                    }
                    ((result->field_4).rowcols)->score_row[uVar20] = alVar32[1]._7_1_ + 0x80;
                    cVar29 = auVar51[0];
                    auVar33[0] = -(auVar27[0] < cVar29);
                    cVar35 = auVar51[1];
                    auVar33[1] = -(auVar27[1] < cVar35);
                    cVar36 = auVar51[2];
                    auVar33[2] = -(auVar27[2] < cVar36);
                    cVar37 = auVar51[3];
                    auVar33[3] = -(auVar27[3] < cVar37);
                    cVar38 = auVar51[4];
                    auVar33[4] = -(auVar27[4] < cVar38);
                    cVar39 = auVar51[5];
                    auVar33[5] = -(auVar27[5] < cVar39);
                    cVar40 = auVar51[6];
                    auVar33[6] = -(auVar27[6] < cVar40);
                    cVar41 = auVar51[7];
                    auVar33[7] = -(auVar27[7] < cVar41);
                    cVar26 = auVar51[8];
                    auVar33[8] = -(auVar27[8] < cVar26);
                    cVar25 = auVar51[9];
                    auVar33[9] = -(auVar27[9] < cVar25);
                    cVar42 = auVar51[10];
                    auVar33[10] = -(auVar27[10] < cVar42);
                    cVar43 = auVar51[0xb];
                    auVar33[0xb] = -(auVar27[0xb] < cVar43);
                    cVar44 = auVar51[0xc];
                    auVar33[0xc] = -(auVar27[0xc] < cVar44);
                    cVar45 = auVar51[0xd];
                    auVar33[0xd] = -(auVar27[0xd] < cVar45);
                    cVar46 = auVar51[0xe];
                    cVar47 = auVar51[0xf];
                    auVar33[0xe] = -(auVar27[0xe] < cVar46);
                    bVar13 = auVar27[0xf] < cVar47;
                    auVar33[0xf] = -bVar13;
                    palVar10 = palVar9;
                    palVar9 = palVar12;
                    if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar33 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar33 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar33 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar33 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar33 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar33 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar33 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar33 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar33 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar33 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar33 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar33 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        bVar13) {
                      auVar27 = auVar51 ^ auVar7;
                      bVar21 = auVar27[0];
                      bVar68 = auVar27[1];
                      auVar34[0] = (bVar21 < bVar68) * bVar21 | (bVar21 >= bVar68) * bVar68;
                      auVar34[1] = 0;
                      bVar21 = auVar27[2];
                      bVar68 = auVar27[3];
                      auVar34[2] = (bVar21 < bVar68) * bVar21 | (bVar21 >= bVar68) * bVar68;
                      auVar34[3] = 0;
                      bVar21 = auVar27[4];
                      bVar68 = auVar27[5];
                      auVar34[4] = (bVar21 < bVar68) * bVar21 | (bVar21 >= bVar68) * bVar68;
                      auVar34[5] = 0;
                      bVar21 = auVar27[6];
                      bVar68 = auVar27[7];
                      auVar34[6] = (bVar21 < bVar68) * bVar21 | (bVar21 >= bVar68) * bVar68;
                      auVar34[7] = 0;
                      bVar21 = auVar27[8];
                      bVar68 = auVar27[9];
                      auVar34[8] = (bVar21 < bVar68) * bVar21 | (bVar21 >= bVar68) * bVar68;
                      auVar34[9] = 0;
                      bVar21 = auVar27[10];
                      bVar68 = auVar27[0xb];
                      auVar34[10] = (bVar21 < bVar68) * bVar21 | (bVar21 >= bVar68) * bVar68;
                      auVar34[0xb] = 0;
                      bVar21 = auVar27[0xc];
                      bVar68 = auVar27[0xd];
                      auVar34[0xc] = (bVar21 < bVar68) * bVar21 | (bVar21 >= bVar68) * bVar68;
                      auVar34[0xd] = 0;
                      bVar21 = auVar27[0xe];
                      bVar68 = auVar27[0xf];
                      auVar34[0xe] = (bVar21 < bVar68) * bVar21 | (bVar21 >= bVar68) * bVar68;
                      auVar34[0xf] = 0;
                      auVar27 = phminposuw(auVar34);
                      bVar21 = auVar27[0] ^ 0x7f;
                      if ((char)('~' - local_80) < (char)bVar21) {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                        local_90 = uVar20;
                        goto LAB_006b906f;
                      }
                      bVar68 = (cVar26 < cVar29) * cVar29 | (cVar26 >= cVar29) * cVar26;
                      bVar70 = (cVar25 < cVar35) * cVar35 | (cVar25 >= cVar35) * cVar25;
                      bVar71 = (cVar42 < cVar36) * cVar36 | (cVar42 >= cVar36) * cVar42;
                      bVar72 = (cVar43 < cVar37) * cVar37 | (cVar43 >= cVar37) * cVar43;
                      bVar73 = (cVar44 < cVar38) * cVar38 | (cVar44 >= cVar38) * cVar44;
                      bVar74 = (cVar45 < cVar39) * cVar39 | (cVar45 >= cVar39) * cVar45;
                      bVar75 = (cVar46 < cVar40) * cVar40 | (cVar46 >= cVar40) * cVar46;
                      bVar76 = (cVar47 < cVar41) * cVar41 | (cVar47 >= cVar41) * cVar47;
                      cVar26 = ('\0' < cVar26) * cVar26;
                      cVar25 = ('\0' < cVar25) * cVar25;
                      cVar42 = ('\0' < cVar42) * cVar42;
                      cVar43 = ('\0' < cVar43) * cVar43;
                      cVar44 = ('\0' < cVar44) * cVar44;
                      cVar45 = ('\0' < cVar45) * cVar45;
                      cVar46 = ('\0' < cVar46) * cVar46;
                      cVar47 = ('\0' < cVar47) * cVar47;
                      bVar68 = ((char)bVar73 < (char)bVar68) * bVar68 |
                               ((char)bVar73 >= (char)bVar68) * bVar73;
                      bVar70 = ((char)bVar74 < (char)bVar70) * bVar70 |
                               ((char)bVar74 >= (char)bVar70) * bVar74;
                      bVar71 = ((char)bVar75 < (char)bVar71) * bVar71 |
                               ((char)bVar75 >= (char)bVar71) * bVar75;
                      bVar72 = ((char)bVar76 < (char)bVar72) * bVar72 |
                               ((char)bVar76 >= (char)bVar72) * bVar76;
                      bVar73 = (cVar26 < (char)bVar73) * bVar73 | (cVar26 >= (char)bVar73) * cVar26;
                      bVar74 = (cVar25 < (char)bVar74) * bVar74 | (cVar25 >= (char)bVar74) * cVar25;
                      bVar75 = (cVar42 < (char)bVar75) * bVar75 | (cVar42 >= (char)bVar75) * cVar42;
                      bVar76 = (cVar43 < (char)bVar76) * bVar76 | (cVar43 >= (char)bVar76) * cVar43;
                      bVar77 = (cVar44 < cVar26) * cVar26 | (cVar44 >= cVar26) * cVar44;
                      bVar78 = (cVar45 < cVar25) * cVar25 | (cVar45 >= cVar25) * cVar45;
                      bVar79 = (cVar46 < cVar42) * cVar42 | (cVar46 >= cVar42) * cVar46;
                      bVar80 = (cVar47 < cVar43) * cVar43 | (cVar47 >= cVar43) * cVar47;
                      cVar44 = ('\0' < cVar44) * cVar44;
                      cVar45 = ('\0' < cVar45) * cVar45;
                      cVar46 = ('\0' < cVar46) * cVar46;
                      cVar47 = ('\0' < cVar47) * cVar47;
                      bVar68 = ((char)bVar71 < (char)bVar68) * bVar68 |
                               ((char)bVar71 >= (char)bVar68) * bVar71;
                      bVar70 = ((char)bVar72 < (char)bVar70) * bVar70 |
                               ((char)bVar72 >= (char)bVar70) * bVar72;
                      bVar71 = ((char)bVar73 < (char)bVar71) * bVar71 |
                               ((char)bVar73 >= (char)bVar71) * bVar73;
                      bVar72 = ((char)bVar74 < (char)bVar72) * bVar72 |
                               ((char)bVar74 >= (char)bVar72) * bVar74;
                      bVar73 = ((char)bVar75 < (char)bVar73) * bVar73 |
                               ((char)bVar75 >= (char)bVar73) * bVar75;
                      bVar74 = ((char)bVar76 < (char)bVar74) * bVar74 |
                               ((char)bVar76 >= (char)bVar74) * bVar76;
                      bVar75 = ((char)bVar77 < (char)bVar75) * bVar75 |
                               ((char)bVar77 >= (char)bVar75) * bVar77;
                      bVar76 = ((char)bVar78 < (char)bVar76) * bVar76 |
                               ((char)bVar78 >= (char)bVar76) * bVar78;
                      bVar77 = ((char)bVar79 < (char)bVar77) * bVar77 |
                               ((char)bVar79 >= (char)bVar77) * bVar79;
                      bVar78 = ((char)bVar80 < (char)bVar78) * bVar78 |
                               ((char)bVar80 >= (char)bVar78) * bVar80;
                      bVar79 = (cVar44 < (char)bVar79) * bVar79 | (cVar44 >= (char)bVar79) * cVar44;
                      bVar80 = (cVar45 < (char)bVar80) * bVar80 | (cVar45 >= (char)bVar80) * cVar45;
                      bVar81 = (cVar46 < cVar44) * cVar44 | (cVar46 >= cVar44) * cVar46;
                      bVar82 = (cVar47 < cVar45) * cVar45 | (cVar47 >= cVar45) * cVar47;
                      cVar46 = ('\0' < cVar46) * cVar46;
                      cVar47 = ('\0' < cVar47) * cVar47;
                      auVar27[0] = ((char)bVar70 < (char)bVar68) * bVar68 |
                                   ((char)bVar70 >= (char)bVar68) * bVar70;
                      auVar27[1] = ((char)bVar71 < (char)bVar70) * bVar70 |
                                   ((char)bVar71 >= (char)bVar70) * bVar71;
                      auVar27[2] = ((char)bVar72 < (char)bVar71) * bVar71 |
                                   ((char)bVar72 >= (char)bVar71) * bVar72;
                      auVar27[3] = ((char)bVar73 < (char)bVar72) * bVar72 |
                                   ((char)bVar73 >= (char)bVar72) * bVar73;
                      auVar27[4] = ((char)bVar74 < (char)bVar73) * bVar73 |
                                   ((char)bVar74 >= (char)bVar73) * bVar74;
                      auVar27[5] = ((char)bVar75 < (char)bVar74) * bVar74 |
                                   ((char)bVar75 >= (char)bVar74) * bVar75;
                      auVar27[6] = ((char)bVar76 < (char)bVar75) * bVar75 |
                                   ((char)bVar76 >= (char)bVar75) * bVar76;
                      auVar27[7] = ((char)bVar77 < (char)bVar76) * bVar76 |
                                   ((char)bVar77 >= (char)bVar76) * bVar77;
                      auVar27[8] = ((char)bVar78 < (char)bVar77) * bVar77 |
                                   ((char)bVar78 >= (char)bVar77) * bVar78;
                      auVar27[9] = ((char)bVar79 < (char)bVar78) * bVar78 |
                                   ((char)bVar79 >= (char)bVar78) * bVar79;
                      auVar27[10] = ((char)bVar80 < (char)bVar79) * bVar79 |
                                    ((char)bVar80 >= (char)bVar79) * bVar80;
                      auVar27[0xb] = ((char)bVar81 < (char)bVar80) * bVar80 |
                                     ((char)bVar81 >= (char)bVar80) * bVar81;
                      auVar27[0xc] = ((char)bVar82 < (char)bVar81) * bVar81 |
                                     ((char)bVar82 >= (char)bVar81) * bVar82;
                      auVar27[0xd] = (cVar46 < (char)bVar82) * bVar82 |
                                     (cVar46 >= (char)bVar82) * cVar46;
                      auVar27[0xe] = (cVar47 < cVar46) * cVar46 | (cVar47 >= cVar46) * cVar47;
                      auVar27[0xf] = ('\0' < cVar47) * cVar47;
                      auVar27 = pshufb(auVar27,(undefined1  [16])0x0);
                      local_b0 = uVar20 & 0xffffffff;
                    }
                    uVar20 = uVar20 + 1;
                  } while( true );
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar15 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_rowcol_striped_profile_sse41_128_8",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int8_t bias = 0;
    int8_t score = 0;
    __m128i vBias;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int8_t maxp = 0;
    __m128i insert_mask;
    /*int8_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    vZero = _mm_set1_epi8(0);
    bias = INT8_MIN;
    score = bias;
    vBias = _mm_set1_epi8(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT8_MAX - (int8_t)(matrix->max+1);
    insert_mask = _mm_cmpgt_epi8(
            _mm_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT8_MAX : (int8_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vBias, segLen);
    parasail_memset___m128i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm_slli_si128(pvHStore[segLen - 1], 1);
        vH = _mm_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8(vH, vE);
            vH = _mm_max_epi8(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm_max_epi8(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm_max_epi8(vH, vMaxH);
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15) - bias;
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi8(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT8_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}